

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  SectionTracker *pSVar7;
  IMutableContext *pIVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  string local_350;
  string local_330;
  TestCase **local_310;
  size_t local_308;
  size_t local_300;
  size_t local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  size_t sStack_2e0;
  TestCaseInfo local_2d0;
  TestCaseStats local_1c0;
  
  local_308 = (this->m_totals).assertions.passed;
  local_2f8 = (this->m_totals).assertions.failed;
  local_300 = (this->m_totals).assertions.failedButOk;
  local_2e8 = (this->m_totals).testCases.passed;
  sStack_2e0 = (this->m_totals).testCases.failed;
  local_2f0 = (this->m_totals).testCases.failedButOk;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2d0,&testCase->super_TestCaseInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar2,&local_2d0);
  local_310 = &this->m_activeTestCase;
  this->m_activeTestCase = testCase;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      pSVar7 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_2d0.name);
      this->m_testCaseTracker = (ITracker *)pSVar7;
      runCurrentTest(this,&local_330,&local_350);
      iVar6 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar6 != '\0') break;
      iVar6 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
    } while ((char)iVar6 == '\0');
    pIVar8 = getCurrentMutableContext();
    iVar6 = (*(pIVar8->super_IContext)._vptr_IContext[5])(pIVar8);
    if ((char)iVar6 == '\0') break;
    iVar6 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  } while ((char)iVar6 == '\0');
  sVar10 = (this->m_totals).assertions.failedButOk - local_300;
  sVar9 = (this->m_totals).assertions.failed - local_2f8;
  (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - local_308;
  (__return_storage_ptr__->assertions).failed = sVar9;
  (__return_storage_ptr__->assertions).failedButOk = sVar10;
  sVar3 = (this->m_totals).testCases.failedButOk;
  lVar11 = 0x20;
  if (sVar9 == 0) {
    lVar11 = (ulong)(sVar10 != 0) * 0x10 + 0x18;
  }
  sVar4 = (this->m_totals).testCases.passed;
  sVar5 = (this->m_totals).testCases.failed;
  (__return_storage_ptr__->testCases).passed = sVar4 - local_2e8;
  (__return_storage_ptr__->testCases).failed = sVar5 - sStack_2e0;
  (__return_storage_ptr__->testCases).failedButOk = sVar3 - local_2f0;
  plVar1 = (long *)((long)&(__return_storage_ptr__->assertions).passed + lVar11);
  *plVar1 = *plVar1 + 1;
  sVar10 = (__return_storage_ptr__->testCases).passed;
  sVar12 = (__return_storage_ptr__->testCases).failed;
  if ((sVar10 != 0 & (byte)(undefined1)local_2d0.properties >> 2) == 1) {
    (__return_storage_ptr__->assertions).failed = sVar9 + 1;
    sVar10 = sVar10 - 1;
    (__return_storage_ptr__->testCases).passed = sVar10;
    sVar12 = sVar12 + 1;
    (__return_storage_ptr__->testCases).failed = sVar12;
  }
  (this->m_totals).testCases.passed = sVar4 + sVar10;
  (this->m_totals).testCases.failed = sVar5 + sVar12;
  (this->m_totals).testCases.failedButOk = sVar3 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar2 = (this->m_reporter).m_p;
  iVar6 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestCaseStats::TestCaseStats
            (&local_1c0,&local_2d0,__return_storage_ptr__,&local_330,&local_350,SUB41(iVar6,0));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_1c0);
  TestCaseStats::~TestCaseStats(&local_1c0);
  local_310[0] = (TestCase *)0x0;
  local_310[1] = (TestCase *)0x0;
  TestCaseInfo::~TestCaseInfo(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT71(local_350.field_2._M_allocated_capacity._1_7_,
                             local_350.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }